

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pragma.cpp
# Opt level: O1

unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true> __thiscall
duckdb::Binder::BindPragma(Binder *this,PragmaInfo *info,QueryErrorContext error_context)

{
  pointer pcVar1;
  ClientContext *pCVar2;
  LogicalType *pLVar3;
  undefined8 uVar4;
  type pEVar5;
  idx_t offset;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  size_t *this_00;
  long *plVar6;
  FunctionBinder function_binder;
  vector<duckdb::Value,_true> params;
  optional_idx bound_idx;
  ErrorData error;
  named_parameter_map_t named_parameters;
  PragmaFunction bound_function;
  ConstantBinder pragma_binder;
  undefined1 local_2e8 [32];
  vector<duckdb::Value,_true> local_2c8;
  optional_idx local_2b0;
  string local_2a8;
  undefined1 local_288 [24];
  undefined1 local_270 [48];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_240 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_208;
  undefined1 local_1d0 [224];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  ConstantBinder local_b8;
  
  local_2c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_208._M_buckets = &local_208._M_single_bucket;
  local_208._M_bucket_count = 1;
  local_208._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_208._M_element_count = 0;
  local_208._M_rehash_policy._M_max_load_factor = 1.0;
  local_208._M_rehash_policy._M_next_resize = 0;
  local_208._M_single_bucket = (__node_base_ptr)0x0;
  pCVar2 = (ClientContext *)(info->name)._M_dataplus._M_p;
  local_2e8._16_8_ = this;
  local_2e8._24_8_ = in_RCX;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"PRAGMA value","");
  ConstantBinder::ConstantBinder(&local_b8,(Binder *)info,pCVar2,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  result_type.ptr = *(LogicalType **)((long)error_context.query_location.index + 0x30);
  pLVar3 = *(LogicalType **)((long)error_context.query_location.index + 0x38);
  if (result_type.ptr != pLVar3) {
    do {
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_288,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_b8,result_type,false);
      pCVar2 = (ClientContext *)(info->name)._M_dataplus._M_p;
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_288);
      ExpressionExecutor::EvaluateScalar((Value *)local_1d0,pCVar2,pEVar5,true);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_2c8,
                 (Value *)local_1d0);
      Value::~Value((Value *)local_1d0);
      if ((pointer)local_288._0_8_ != (pointer)0x0) {
        (**(code **)(*(_func_int **)local_288._0_8_ + 8))();
      }
      result_type.ptr = (LogicalType *)&(result_type.ptr)->type_info_;
    } while (result_type.ptr != pLVar3);
  }
  plVar6 = *(long **)((long)error_context.query_location.index + 0x58);
  if (plVar6 != (long *)0x0) {
    do {
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_2e8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_b8,(LogicalType *)(plVar6 + 5),false);
      pCVar2 = (ClientContext *)(info->name)._M_dataplus._M_p;
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_2e8);
      ExpressionExecutor::EvaluateScalar((Value *)local_288,pCVar2,pEVar5,true);
      local_1d0._0_8_ = local_1d0 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d0,plVar6[1],plVar6[2] + plVar6[1]);
      Value::Value((Value *)(local_1d0 + 0x20),(Value *)local_288);
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,duckdb::Value>>
                (&local_208,
                 (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_1d0);
      Value::~Value((Value *)(local_1d0 + 0x20));
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_);
      }
      Value::~Value((Value *)local_288);
      if ((Binder *)local_2e8._0_8_ != (Binder *)0x0) {
        (*(((FunctionEntry *)local_2e8._0_8_)->super_StandardEntry).super_InCatalogEntry.
          super_CatalogEntry._vptr_CatalogEntry[1])();
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  pCVar2 = (ClientContext *)(info->name)._M_dataplus._M_p;
  pcVar1 = local_1d0 + 0x10;
  local_1d0._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,anon_var_dwarf_63b5960 + 9);
  local_288._0_8_ = (pointer)(local_288 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"main","");
  local_2e8._0_8_ =
       Catalog::GetEntry<duckdb::PragmaFunctionCatalogEntry>
                 (pCVar2,(string *)local_1d0,(string *)local_288,
                  (string *)((long)error_context.query_location.index + 0x10),THROW_EXCEPTION,
                  (QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::PragmaFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::PragmaFunctionCatalogEntry,_true> *)local_2e8);
  uVar4 = local_2e8._0_8_;
  if ((pointer)local_288._0_8_ != (pointer)(local_288 + 0x10)) {
    operator_delete((void *)local_288._0_8_);
  }
  if ((pointer)local_1d0._0_8_ != pcVar1) {
    operator_delete((void *)local_1d0._0_8_);
  }
  FunctionBinder::FunctionBinder((FunctionBinder *)local_2e8,(Binder *)info);
  ErrorData::ErrorData((ErrorData *)local_288);
  this_00 = &(((BindContext *)(uVar4 + 0x88))->cte_bindings)._M_h._M_rehash_policy._M_next_resize;
  local_2b0 = FunctionBinder::BindFunction
                        ((FunctionBinder *)local_2e8,
                         (string *)
                         &(((case_insensitive_map_t<reference<CommonTableExpressionInfo>_> *)
                           (uVar4 + 0x18))->_M_h)._M_bucket_count,(PragmaFunctionSet *)this_00,
                         &local_2c8,(ErrorData *)local_288);
  if (local_2b0.index != 0xffffffffffffffff) {
    offset = optional_idx::GetIndex(&local_2b0);
    FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
              ((PragmaFunction *)local_1d0,(FunctionSet<duckdb::PragmaFunction> *)this_00,offset);
    BindNamedParameters((named_parameter_type_map_t *)&local_f0,(named_parameter_map_t *)&local_208,
                        (QueryErrorContext *)(local_2e8 + 0x18),(string *)(local_1d0 + 8));
    make_uniq<duckdb::BoundPragmaInfo,duckdb::PragmaFunction,duckdb::vector<duckdb::Value,true>,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
              ((duckdb *)local_2e8._16_8_,(PragmaFunction *)local_1d0,&local_2c8,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)&local_208);
    local_1d0._0_8_ = &PTR__PragmaFunction_02477550;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_f0);
    SimpleNamedParameterFunction::~SimpleNamedParameterFunction
              ((SimpleNamedParameterFunction *)local_1d0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_240);
    if ((vector<duckdb::DummyBinding,_true> *)local_270._16_8_ !=
        (vector<duckdb::DummyBinding,_true> *)(local_270 + 0x20)) {
      operator_delete((void *)local_270._16_8_);
    }
    if ((element_type *)local_288._8_8_ != (element_type *)local_270) {
      operator_delete((void *)local_288._8_8_);
    }
    local_b8.super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)&PTR__ConstantBinder_0248e6f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.clause._M_dataplus._M_p != &local_b8.clause.field_2) {
      operator_delete(local_b8.clause._M_dataplus._M_p);
    }
    ExpressionBinder::~ExpressionBinder(&local_b8.super_ExpressionBinder);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_208);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_2c8);
    return (unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>)
           (_Tuple_impl<0UL,_duckdb::BoundPragmaInfo_*,_std::default_delete<duckdb::BoundPragmaInfo>_>
            )local_2e8._16_8_;
  }
  ErrorData::AddQueryLocation((ErrorData *)local_288,(QueryErrorContext)local_2e8._24_8_);
  local_1d0._0_8_ = pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,anon_var_dwarf_63b5960 + 9);
  ErrorData::Throw((ErrorData *)local_288,(string *)local_1d0);
}

Assistant:

unique_ptr<BoundPragmaInfo> Binder::BindPragma(PragmaInfo &info, QueryErrorContext error_context) {
	vector<Value> params;
	named_parameter_map_t named_parameters;

	// resolve the parameters
	ConstantBinder pragma_binder(*this, context, "PRAGMA value");
	for (auto &param : info.parameters) {
		auto bound_value = pragma_binder.Bind(param);
		auto value = ExpressionExecutor::EvaluateScalar(context, *bound_value, true);
		params.push_back(std::move(value));
	}

	for (auto &entry : info.named_parameters) {
		auto bound_value = pragma_binder.Bind(entry.second);
		auto value = ExpressionExecutor::EvaluateScalar(context, *bound_value, true);
		named_parameters.insert(make_pair(entry.first, std::move(value)));
	}

	// bind the pragma function
	auto &entry = Catalog::GetEntry<PragmaFunctionCatalogEntry>(context, INVALID_CATALOG, DEFAULT_SCHEMA, info.name);
	FunctionBinder function_binder(*this);
	ErrorData error;
	auto bound_idx = function_binder.BindFunction(entry.name, entry.functions, params, error);
	if (!bound_idx.IsValid()) {
		D_ASSERT(error.HasError());
		error.AddQueryLocation(error_context);
		error.Throw();
	}
	auto bound_function = entry.functions.GetFunctionByOffset(bound_idx.GetIndex());
	// bind and check named params
	BindNamedParameters(bound_function.named_parameters, named_parameters, error_context, bound_function.name);
	return make_uniq<BoundPragmaInfo>(std::move(bound_function), std::move(params), std::move(named_parameters));
}